

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall trieste::NodeDef::set_location(NodeDef *this,Location *loc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  size_t sVar3;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_68;
  iterator iStack_60;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_58;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_50;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this);
  lVar2 = local_40;
  if (*(long *)(local_40 + 0x18) == 0) {
    *(element_type **)(local_40 + 0x18) =
         (loc->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __r = &(loc->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x20),__r);
    sVar3 = loc->len;
    *(size_t *)(lVar2 + 0x28) = loc->pos;
    *(size_t *)(lVar2 + 0x30) = sVar3;
    local_68 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    iStack_60._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_58 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_50.second._M_current = *(shared_ptr<trieste::NodeDef> **)(local_40 + 0x58);
    local_50.first = (shared_ptr<trieste::NodeDef> *)&local_40;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_68,(iterator)0x0,&local_50);
    if (local_68 != iStack_60._M_current) {
      do {
        p_Var1 = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                 iStack_60._M_current[-1].second._M_current;
        if (p_Var1 == *(__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&((((iStack_60._M_current[-1].first)->
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->children).
                               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                               ._M_impl.super__Vector_impl_data + 8)) {
          iStack_60._M_current = iStack_60._M_current + -1;
        }
        else {
          iStack_60._M_current[-1].second._M_current =
               (shared_ptr<trieste::NodeDef> *)(p_Var1 + 0x10);
          lVar2 = *(long *)&p_Var1->field_0x0;
          if (*(long *)(lVar2 + 0x18) == 0) {
            *(element_type **)(lVar2 + 0x18) =
                 (loc->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x20),__r);
            sVar3 = loc->len;
            *(size_t *)(lVar2 + 0x28) = loc->pos;
            *(size_t *)(lVar2 + 0x30) = sVar3;
            local_50.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)(*(long *)&p_Var1->field_0x0 + 0x58);
            local_50.first = (shared_ptr<trieste::NodeDef> *)p_Var1;
            if (iStack_60._M_current == local_58) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_68,iStack_60,&local_50);
            }
            else {
              (iStack_60._M_current)->first = (shared_ptr<trieste::NodeDef> *)p_Var1;
              ((iStack_60._M_current)->second)._M_current = local_50.second._M_current;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
        }
      } while (local_68 != iStack_60._M_current);
    }
    if (local_68 !=
        (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void set_location(const Location& loc)
    {
      traverse([&](Node& current) {
        auto& current_loc = current->location_;
        if (current_loc.source)
          return false;
        current_loc = loc;
        return true;
      });
    }